

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SameLine(float offset_from_start_x,float spacing_w)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  ImGuiWindow *window;
  float spacing_w_local;
  float offset_from_start_x_local;
  
  pIVar1 = GetCurrentWindow();
  if ((pIVar1->SkipItems & 1U) == 0) {
    window._0_4_ = spacing_w;
    if ((offset_from_start_x != 0.0) || (NAN(offset_from_start_x))) {
      if (spacing_w < 0.0) {
        window._0_4_ = 0.0;
      }
      (pIVar1->DC).CursorPos.x =
           ((pIVar1->Pos).x - (pIVar1->Scroll).x) + offset_from_start_x + window._0_4_ +
           (pIVar1->DC).GroupOffset.x + (pIVar1->DC).ColumnsOffset.x;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    }
    else {
      if (spacing_w < 0.0) {
        window._0_4_ = (GImGui->Style).ItemSpacing.x;
      }
      (pIVar1->DC).CursorPos.x = (pIVar1->DC).CursorPosPrevLine.x + window._0_4_;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    }
    (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  return;
}

Assistant:

void ImGui::SameLine(float offset_from_start_x, float spacing_w)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    if (offset_from_start_x != 0.0f)
    {
        if (spacing_w < 0.0f) spacing_w = 0.0f;
        window->DC.CursorPos.x = window->Pos.x - window->Scroll.x + offset_from_start_x + spacing_w + window->DC.GroupOffset.x + window->DC.ColumnsOffset.x;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    else
    {
        if (spacing_w < 0.0f) spacing_w = g.Style.ItemSpacing.x;
        window->DC.CursorPos.x = window->DC.CursorPosPrevLine.x + spacing_w;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    window->DC.CurrLineSize = window->DC.PrevLineSize;
    window->DC.CurrLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
}